

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

uint32_t helper_bcdus_ppc(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,uint32_t ps)

{
  uint64_t local_58;
  ppc_avr_t ret;
  _Bool local_39;
  int local_38;
  int iStack_34;
  _Bool ox_flag;
  int invalid;
  int i;
  int cr;
  uint32_t ps_local;
  ppc_avr_t *b_local;
  ppc_avr_t *a_local;
  ppc_avr_t *r_local;
  
  local_38 = 0;
  local_39 = false;
  local_58 = b->u64[0];
  ret.u64[0] = b->u64[1];
  iStack_34 = 0;
  i = ps;
  _cr = b;
  b_local = a;
  a_local = r;
  while( true ) {
    if (0x1f < iStack_34) {
      iStack_34 = (int)b_local->s8[8];
      if (iStack_34 < 0x20) {
        if (iStack_34 < -0x1f) {
          ret.u64[0] = 0;
          local_58 = 0;
        }
        else if (iStack_34 < 1) {
          urshift(&local_58,ret.u64,iStack_34 * -4);
        }
        else {
          ulshift(&local_58,ret.u64,iStack_34 << 2,&local_39);
        }
      }
      else {
        local_39 = true;
        ret.u64[0] = 0;
        local_58 = 0;
      }
      a_local->u64[0] = local_58;
      a_local->u64[1] = ret.u64[0];
      invalid = bcd_cmp_zero(a_local);
      if ((local_39 & 1U) != 0) {
        invalid = invalid | 1;
      }
      return invalid;
    }
    bcd_get_digit(_cr,iStack_34,&local_38);
    if (local_38 != 0) break;
    iStack_34 = iStack_34 + 1;
  }
  return 1;
}

Assistant:

uint32_t helper_bcdus(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b, uint32_t ps)
{
    int cr;
    int i;
    int invalid = 0;
    bool ox_flag = false;
    ppc_avr_t ret = *b;

    for (i = 0; i < 32; i++) {
        bcd_get_digit(b, i, &invalid);

        if (unlikely(invalid)) {
            return CRF_SO;
        }
    }

    i = a->VsrSB(7);
    if (i >= 32) {
        ox_flag = true;
        ret.VsrD(1) = ret.VsrD(0) = 0;
    } else if (i <= -32) {
        ret.VsrD(1) = ret.VsrD(0) = 0;
    } else if (i > 0) {
        ulshift(&ret.VsrD(1), &ret.VsrD(0), i * 4, &ox_flag);
    } else {
        urshift(&ret.VsrD(1), &ret.VsrD(0), -i * 4);
    }
    *r = ret;

    cr = bcd_cmp_zero(r);
    if (ox_flag) {
        cr |= CRF_SO;
    }

    return cr;
}